

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void deserialize_node<char_const*,int,unsigned_int>
               (IsoHPlane *node,char **in,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
               vector<char,_std::allocator<char>_> *buffer2,bool diff_endian)

{
  vector<ColType,_std::allocator<ColType>_> *this;
  double *pdVar1;
  pointer puVar2;
  pointer pCVar3;
  pointer pvVar4;
  size_t n_els;
  size_type sVar5;
  size_t sVar6;
  pointer vec;
  size_t veclen;
  double data_doubles [5];
  size_t data_sizets [10];
  size_t local_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  size_t local_88;
  size_t sStack_80;
  size_t local_78;
  size_type local_70;
  size_t local_68;
  size_t local_60;
  size_type local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  
  if (!interrupt_switch) {
    pdVar1 = (double *)*in;
    local_98 = pdVar1[4];
    local_b8 = *pdVar1;
    dStack_b0 = pdVar1[1];
    local_a8 = pdVar1[2];
    dStack_a0 = pdVar1[3];
    *in = (char *)(pdVar1 + 5);
    if (diff_endian) {
      swap_endianness<double>(&local_b8,5);
    }
    node->split_point = local_b8;
    node->score = dStack_b0;
    node->range_low = local_a8;
    node->range_high = dStack_a0;
    node->remainder = local_98;
    read_bytes<unsigned_long,unsigned_int>(&local_88,10,in,buffer2,diff_endian);
    node->hplane_left = local_88;
    node->hplane_right = sStack_80;
    read_bytes<unsigned_long,unsigned_int>(&node->col_num,local_78,in,buffer2,diff_endian);
    if (local_70 != 0) {
      this = &node->col_type;
      std::vector<ColType,_std::allocator<ColType>_>::resize(this,local_70);
      if ((node->col_type).super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage !=
          (node->col_type).super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::__shrink_to_fit_aux<std::vector<ColType,_std::allocator<ColType>_>,_true>::_S_do_it
                  (this);
      }
      if ((ulong)((long)(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start) < local_70) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,local_70 * 2);
      }
      sVar5 = local_70;
      if (local_70 != 0) {
        memcpy((buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,*in,local_70);
        *in = *in + sVar5;
      }
      if (local_70 != 0) {
        puVar2 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        pCVar3 = (this->super__Vector_base<ColType,_std::allocator<ColType>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        sVar6 = 0;
        do {
          pCVar3[sVar6] = (uint)puVar2[sVar6];
          sVar6 = sVar6 + 1;
        } while (local_70 != sVar6);
      }
    }
    read_bytes<double>(&node->coef,local_68,in);
    if (diff_endian) {
      swap_endianness<double>
                ((node->coef).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,local_68);
    }
    read_bytes<double>(&node->mean,local_60,in);
    if (diff_endian) {
      swap_endianness<double>
                ((node->mean).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,local_60);
    }
    if (local_58 != 0) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(&node->cat_coef,local_58);
      if ((node->cat_coef).
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
          (node->cat_coef).
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        __shrink_to_fit_aux<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_true>
        ::_S_do_it(&node->cat_coef);
      }
      vec = (node->cat_coef).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = (node->cat_coef).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (vec != pvVar4) {
        do {
          read_bytes<unsigned_long,unsigned_int>(&local_c0,1,in,buffer2,diff_endian);
          n_els = local_c0;
          read_bytes<double>(vec,local_c0,in);
          if (diff_endian) {
            swap_endianness<double>
                      ((vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start,n_els);
          }
          vec = vec + 1;
        } while (vec != pvVar4);
      }
    }
    read_bytes<int,int>(&node->chosen_cat,local_50,in,buffer2,diff_endian);
    read_bytes<double>(&node->fill_val,local_48,in);
    if (diff_endian) {
      swap_endianness<double>
                ((node->fill_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,local_48);
    }
    read_bytes<double>(&node->fill_new,local_40,in);
    if (diff_endian) {
      swap_endianness<double>
                ((node->fill_new).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,local_40);
    }
  }
  return;
}

Assistant:

void deserialize_node(IsoHPlane &node, itype &in, std::vector<uint8_t> &buffer, std::vector<char> &buffer2, const bool diff_endian)
{
    if (interrupt_switch) return;

    double data_doubles[5];
    read_bytes<double, double>((void*)data_doubles, (size_t)5, in, buffer2, diff_endian);
    node.split_point = data_doubles[0];
    node.score = data_doubles[1];
    node.range_low = data_doubles[2];
    node.range_high = data_doubles[3];
    node.remainder = data_doubles[4];

    size_t data_sizets[10];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)10, in, buffer2, diff_endian);

    node.hplane_left = data_sizets[0];
    node.hplane_right = data_sizets[1];

    read_bytes<size_t, saved_size_t>(node.col_num, data_sizets[2], in, buffer2, diff_endian);

    if (data_sizets[3]) {
        node.col_type.resize(data_sizets[3]);
        node.col_type.shrink_to_fit();
        if (buffer.size() < data_sizets[3])
            buffer.resize((size_t)2 * data_sizets[3]);
        read_bytes<uint8_t>((void*)buffer.data(), data_sizets[3], in);
        for (size_t ix = 0; ix < data_sizets[3]; ix++)
            node.col_type[ix] = (ColType)buffer[ix];
    }

    read_bytes<double, double>(node.coef, data_sizets[4], in, buffer2, diff_endian);

    read_bytes<double, double>(node.mean, data_sizets[5], in, buffer2, diff_endian);

    if (data_sizets[6]) {
        node.cat_coef.resize(data_sizets[6]);
        node.cat_coef.shrink_to_fit();
        size_t veclen;
        for (auto &vec : node.cat_coef) {
            read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer2, diff_endian);
            read_bytes<double, double>(vec, veclen, in, buffer2, diff_endian);
        }
    }

    read_bytes<int, saved_int_t>(node.chosen_cat, data_sizets[7], in, buffer2, diff_endian);

    read_bytes<double, double>(node.fill_val, data_sizets[8], in, buffer2, diff_endian);

    read_bytes<double, double>(node.fill_new, data_sizets[9], in, buffer2, diff_endian);
}